

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void exprToRegister(Expr *pExpr,int iReg)

{
  byte *pbVar1;
  ExprList_item *pEVar2;
  
  while ((pExpr != (Expr *)0x0 && ((pExpr->flags & 0x82000) != 0))) {
    if ((pExpr->flags >> 0x13 & 1) == 0) {
      pEVar2 = (ExprList_item *)&pExpr->pLeft;
    }
    else {
      pEVar2 = ((pExpr->x).pList)->a;
    }
    pExpr = pEVar2->pExpr;
  }
  if (pExpr != (Expr *)0x0) {
    pExpr->op2 = pExpr->op;
    pExpr->op = 0xb0;
    pExpr->iTable = iReg;
    pbVar1 = (byte *)((long)&pExpr->flags + 1);
    *pbVar1 = *pbVar1 & 0xdf;
  }
  return;
}

Assistant:

SQLITE_PRIVATE Expr *sqlite3ExprSkipCollateAndLikely(Expr *pExpr){
  while( pExpr && ExprHasProperty(pExpr, EP_Skip|EP_Unlikely) ){
    if( ExprHasProperty(pExpr, EP_Unlikely) ){
      assert( ExprUseXList(pExpr) );
      assert( pExpr->x.pList->nExpr>0 );
      assert( pExpr->op==TK_FUNCTION );
      pExpr = pExpr->x.pList->a[0].pExpr;
    }else{
      assert( pExpr->op==TK_COLLATE );
      pExpr = pExpr->pLeft;
    }
  }
  return pExpr;
}